

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O2

bool __thiscall
ELFIO::symbol_section_accessor_template<const_ELFIO::section>::generic_get_symbol<ELFIO::Elf32_Sym>
          (symbol_section_accessor_template<const_ELFIO::section> *this,Elf_Xword index,string *name
          ,Elf64_Addr *value,Elf_Xword *size,uchar *bind,uchar *type,Elf_Half *section_index,
          uchar *other)

{
  ushort uVar1;
  elfio *peVar2;
  elfio *peVar3;
  pointer puVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  Elf_Xword EVar7;
  long lVar8;
  undefined4 extraout_var_01;
  char *pcVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  __uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_> local_38;
  undefined4 extraout_var_00;
  
  iVar5 = (*this->symbol_section->_vptr_section[0x18])();
  if ((CONCAT44(extraout_var,iVar5) != 0) && (EVar7 = get_symbols_num(this), index < EVar7)) {
    iVar5 = (*this->symbol_section->_vptr_section[0x18])();
    lVar8 = CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*this->symbol_section->_vptr_section[0xf])();
    lVar12 = CONCAT44(extraout_var_01,iVar5) * index;
    peVar2 = this->elf_file;
    uVar6 = (*this->symbol_section->_vptr_section[0xb])();
    peVar3 = (peVar2->sections).parent;
    puVar4 = (peVar3->sections_).
             super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uVar6 & 0xffff) <
        (ulong)((long)(peVar3->sections_).
                      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)) {
      local_38._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
           *(tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_> *)
            &puVar4[uVar6 & 0xffff]._M_t;
    }
    else {
      local_38._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
           (tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_>)
           (_Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>)0x0;
    }
    uVar6 = *(uint *)(lVar8 + lVar12);
    uVar11 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    if ((peVar2->convertor).need_conversion == false) {
      uVar11 = uVar6;
    }
    pcVar9 = string_section_accessor_template<ELFIO::section>::get_string
                       ((string_section_accessor_template<ELFIO::section> *)&local_38,uVar11);
    if (pcVar9 != (char *)0x0) {
      std::__cxx11::string::assign((char *)name);
    }
    uVar6 = *(uint *)(lVar8 + 4 + lVar12);
    bVar13 = (peVar2->convertor).need_conversion == false;
    uVar11 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    if (bVar13) {
      uVar11 = uVar6;
    }
    *value = (ulong)uVar11;
    uVar6 = *(uint *)(lVar8 + 8 + lVar12);
    uVar11 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    if (bVar13) {
      uVar11 = uVar6;
    }
    *size = (ulong)uVar11;
    *bind = *(byte *)(lVar8 + 0xc + lVar12) >> 4;
    *type = *(byte *)(lVar8 + 0xc + lVar12) & 0xf;
    uVar1 = *(ushort *)(lVar8 + 0xe + lVar12);
    uVar10 = uVar1 << 8 | uVar1 >> 8;
    if ((peVar2->convertor).need_conversion == false) {
      uVar10 = uVar1;
    }
    *section_index = uVar10;
    *other = *(uchar *)(lVar8 + 0xd + lVar12);
    return true;
  }
  return false;
}

Assistant:

bool generic_get_symbol( Elf_Xword      index,
                             std::string&   name,
                             Elf64_Addr&    value,
                             Elf_Xword&     size,
                             unsigned char& bind,
                             unsigned char& type,
                             Elf_Half&      section_index,
                             unsigned char& other ) const
    {
        bool ret = false;

        if ( nullptr != symbol_section->get_data() &&
             index < get_symbols_num() ) {
            const auto* pSym = reinterpret_cast<const T*>(
                symbol_section->get_data() +
                index * symbol_section->get_entry_size() );

            const endianness_convertor& convertor = elf_file.get_convertor();

            section* string_section =
                elf_file.sections[get_string_table_index()];
            string_section_accessor str_reader( string_section );
            const char*             pStr =
                str_reader.get_string( convertor( pSym->st_name ) );
            if ( nullptr != pStr ) {
                name = pStr;
            }
            value         = convertor( pSym->st_value );
            size          = convertor( pSym->st_size );
            bind          = ELF_ST_BIND( pSym->st_info );
            type          = ELF_ST_TYPE( pSym->st_info );
            section_index = convertor( pSym->st_shndx );
            other         = pSym->st_other;

            ret = true;
        }

        return ret;
    }